

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpContext.cpp
# Opt level: O0

int xmrig::HttpContext::onHeaderValue(http_parser *parser,char *at,size_t length)

{
  ulong in_RDX;
  char *in_RSI;
  long in_RDI;
  HttpContext *ctx;
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [32];
  long local_20;
  
  local_20 = *(long *)(in_RDI + 0x18);
  if ((*(byte *)(local_20 + 0x90) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,in_RSI,in_RDX,&local_41);
    std::__cxx11::string::operator=((string *)(local_20 + 200),local_40);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    *(undefined1 *)(local_20 + 0x90) = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,in_RSI,in_RDX,&local_79);
    std::__cxx11::string::operator+=((string *)(local_20 + 200),local_78);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
  }
  return 0;
}

Assistant:

int xmrig::HttpContext::onHeaderValue(http_parser *parser, const char *at, size_t length)
{
    auto ctx = static_cast<HttpContext*>(parser->data);

    if (!ctx->m_wasHeaderValue) {
        ctx->m_lastHeaderValue = std::string(at, length);
        ctx->m_wasHeaderValue  = true;
    } else {
        ctx->m_lastHeaderValue += std::string(at, length);
    }

    return 0;
}